

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AddColumn(Parse *pParse,Token sName,Token sType)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  Table *pTVar6;
  sqlite3 *db;
  char cVar7;
  int iVar8;
  byte *z;
  byte *pbVar9;
  Column *pCVar10;
  size_t sVar11;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  byte bVar15;
  u8 uVar16;
  u64 n;
  uint uVar17;
  long lVar18;
  long lVar19;
  char **ppcVar20;
  Column *pCol;
  uint uVar21;
  ulong __n;
  long in_FS_OFFSET;
  char local_72;
  u8 local_71;
  Token local_58;
  Token local_48;
  long local_38;
  
  pcVar13 = sType.z;
  local_48.z = sName.z;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.n = sName.n;
  uVar17 = sType.n;
  pTVar6 = pParse->pNewTable;
  local_58.z = pcVar13;
  local_58.n = uVar17;
  if (pTVar6 != (Table *)0x0) {
    db = pParse->db;
    if (db->aLimit[2] <= (int)pTVar6->nCol) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        sqlite3ErrorMsg(pParse,"too many columns on %s",pTVar6->zName);
        return;
      }
      goto LAB_00164f08;
    }
    if (pParse->eParseMode < 2) {
      sqlite3DequoteToken(&local_48);
    }
    if (0xf < uVar17) {
      iVar8 = sqlite3_strnicmp(pcVar13 + (uVar17 - 6),"always",6);
      if (iVar8 == 0) {
        uVar21 = uVar17 - 5;
        uVar12 = (ulong)(uVar17 - 6);
        do {
          if (uVar12 == 0) {
            uVar21 = 0;
            break;
          }
          lVar19 = uVar12 - 1;
          uVar21 = uVar21 - 1;
          uVar12 = uVar12 - 1;
        } while ((""[(byte)pcVar13[lVar19]] & 1) != 0);
        local_58.n = uVar21;
        if (8 < uVar21) {
          iVar8 = sqlite3_strnicmp(pcVar13 + (uVar21 - 9),"generated",9);
          if (iVar8 == 0) {
            local_58.n = uVar21 - 8;
            uVar12 = (ulong)(uVar21 - 9);
            do {
              if (uVar12 == 0) {
                local_58.n = 0;
                break;
              }
              lVar19 = uVar12 - 1;
              local_58.n = local_58.n - 1;
              uVar12 = uVar12 - 1;
            } while ((""[(byte)pcVar13[lVar19]] & 1) != 0);
          }
        }
      }
    }
    local_71 = '\x01';
    if (local_58.n < 3) {
      local_72 = 'A';
      bVar15 = 0;
    }
    else {
      local_72 = 'A';
      sqlite3DequoteToken(&local_58);
      uVar17 = local_58.n;
      pcVar13 = local_58.z;
      bVar15 = 0x10;
      ppcVar20 = sqlite3StdType;
      lVar19 = 0;
      do {
        if ((uVar17 == "\x03\x04\x03\a\x04\x04"[lVar19]) &&
           (iVar8 = sqlite3_strnicmp(pcVar13,*ppcVar20,uVar17), iVar8 == 0)) {
          local_58.n = 0;
          local_72 = "CADDEB"[lVar19];
          local_71 = (((uint)lVar19 & 3) == 1) * '\x04' + '\x01';
          goto LAB_00164cc0;
        }
        lVar19 = lVar19 + 1;
        bVar15 = bVar15 + 0x10;
        ppcVar20 = ppcVar20 + 1;
      } while (lVar19 != 6);
      bVar15 = 0;
    }
LAB_00164cc0:
    uVar12 = (ulong)local_48.n;
    __n = (ulong)local_58.n;
    n = ((__n + uVar12) - (ulong)(__n == 0)) + 2;
    if (db == (sqlite3 *)0x0) {
      z = (byte *)sqlite3Malloc(n);
    }
    else {
      z = (byte *)sqlite3DbMallocRawNN(db,n);
    }
    if (z != (byte *)0x0) {
      if (1 < pParse->eParseMode) {
        sqlite3RenameTokenMap(pParse,z,&local_48);
      }
      memcpy(z,local_48.z,uVar12);
      z[uVar12] = 0;
      sqlite3Dequote((char *)z);
      bVar1 = *z;
      if (bVar1 == 0) {
        uVar16 = '\0';
      }
      else {
        uVar16 = '\0';
        pbVar9 = z;
        do {
          pbVar9 = pbVar9 + 1;
          uVar16 = uVar16 + ""[bVar1];
          bVar1 = *pbVar9;
        } while (bVar1 != 0);
      }
      lVar19 = (long)pTVar6->nCol;
      if (0 < lVar19) {
        lVar14 = 0;
LAB_00164d83:
        if (pTVar6->aCol[lVar14].hName == uVar16) {
          lVar18 = 0;
          do {
            bVar1 = z[lVar18];
            bVar2 = pTVar6->aCol[lVar14].zCnName[lVar18];
            if (bVar1 == bVar2) {
              if ((ulong)bVar1 == 0) goto LAB_00164dbf;
            }
            else if (""[bVar1] != ""[bVar2]) goto LAB_00164dbf;
            lVar18 = lVar18 + 1;
          } while( true );
        }
        goto LAB_00164dc8;
      }
LAB_00164dd0:
      pCVar10 = (Column *)sqlite3DbRealloc(db,pTVar6->aCol,lVar19 * 0x10 + 0x10);
      if (pCVar10 == (Column *)0x0) {
LAB_00164e7f:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          sqlite3DbFreeNN(db,z);
          return;
        }
        goto LAB_00164f08;
      }
      pTVar6->aCol = pCVar10;
      sVar3 = pTVar6->nCol;
      pCol = pCVar10 + sVar3;
      pCVar10[sVar3].zCnName = (char *)0x0;
      *(undefined8 *)&pCVar10[sVar3].field_0x8 = 0;
      pCVar10[sVar3].zCnName = (char *)z;
      pCVar10[sVar3].hName = uVar16;
      if (__n == 0) {
        pCol->affinity = local_72;
        pCol->field_0x8 = pCol->field_0x8 & 0xf | bVar15;
        pCol->szEst = local_71;
      }
      else {
        sVar11 = strlen((char *)z);
        uVar12 = (ulong)((uint)sVar11 & 0x3fffffff);
        pbVar9 = z + uVar12 + 1;
        memcpy(pbVar9,local_58.z,__n);
        z[__n + 1 + uVar12] = 0;
        sqlite3Dequote((char *)pbVar9);
        cVar7 = sqlite3AffinityType((char *)pbVar9,pCol);
        pCol->affinity = cVar7;
        *(byte *)&pCol->colFlags = (byte)pCol->colFlags | 4;
      }
      uVar4 = pTVar6->nCol;
      uVar5 = pTVar6->nNVCol;
      pTVar6->nCol = uVar4 + 1;
      pTVar6->nNVCol = uVar5 + 1;
      (pParse->constraintName).n = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00164f08:
  __stack_chk_fail();
LAB_00164dbf:
  if (bVar1 == bVar2) {
    sqlite3ErrorMsg(pParse,"duplicate column name: %s",z);
    goto LAB_00164e7f;
  }
LAB_00164dc8:
  lVar14 = lVar14 + 1;
  if (lVar14 == lVar19) goto LAB_00164dd0;
  goto LAB_00164d83;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddColumn(Parse *pParse, Token sName, Token sType){
  Table *p;
  int i;
  char *z;
  char *zType;
  Column *pCol;
  sqlite3 *db = pParse->db;
  u8 hName;
  Column *aNew;
  u8 eType = COLTYPE_CUSTOM;
  u8 szEst = 1;
  char affinity = SQLITE_AFF_BLOB;

  if( (p = pParse->pNewTable)==0 ) return;
  if( p->nCol+1>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns on %s", p->zName);
    return;
  }
  if( !IN_RENAME_OBJECT ) sqlite3DequoteToken(&sName);

  /* Because keywords GENERATE ALWAYS can be converted into identifiers
  ** by the parser, we can sometimes end up with a typename that ends
  ** with "generated always".  Check for this case and omit the surplus
  ** text. */
  if( sType.n>=16
   && sqlite3_strnicmp(sType.z+(sType.n-6),"always",6)==0
  ){
    sType.n -= 6;
    while( ALWAYS(sType.n>0) && sqlite3Isspace(sType.z[sType.n-1]) ) sType.n--;
    if( sType.n>=9
     && sqlite3_strnicmp(sType.z+(sType.n-9),"generated",9)==0
    ){
      sType.n -= 9;
      while( sType.n>0 && sqlite3Isspace(sType.z[sType.n-1]) ) sType.n--;
    }
  }

  /* Check for standard typenames.  For standard typenames we will
  ** set the Column.eType field rather than storing the typename after
  ** the column name, in order to save space. */
  if( sType.n>=3 ){
    sqlite3DequoteToken(&sType);
    for(i=0; i<SQLITE_N_STDTYPE; i++){
       if( sType.n==sqlite3StdTypeLen[i]
        && sqlite3_strnicmp(sType.z, sqlite3StdType[i], sType.n)==0
       ){
         sType.n = 0;
         eType = i+1;
         affinity = sqlite3StdTypeAffinity[i];
         if( affinity<=SQLITE_AFF_TEXT ) szEst = 5;
         break;
       }
    }
  }

  z = sqlite3DbMallocRaw(db, (i64)sName.n + 1 + (i64)sType.n + (sType.n>0) );
  if( z==0 ) return;
  if( IN_RENAME_OBJECT ) sqlite3RenameTokenMap(pParse, (void*)z, &sName);
  memcpy(z, sName.z, sName.n);
  z[sName.n] = 0;
  sqlite3Dequote(z);
  hName = sqlite3StrIHash(z);
  for(i=0; i<p->nCol; i++){
    if( p->aCol[i].hName==hName && sqlite3StrICmp(z, p->aCol[i].zCnName)==0 ){
      sqlite3ErrorMsg(pParse, "duplicate column name: %s", z);
      sqlite3DbFree(db, z);
      return;
    }
  }
  aNew = sqlite3DbRealloc(db,p->aCol,((i64)p->nCol+1)*sizeof(p->aCol[0]));
  if( aNew==0 ){
    sqlite3DbFree(db, z);
    return;
  }
  p->aCol = aNew;
  pCol = &p->aCol[p->nCol];
  memset(pCol, 0, sizeof(p->aCol[0]));
  pCol->zCnName = z;
  pCol->hName = hName;
  sqlite3ColumnPropertiesFromName(p, pCol);

  if( sType.n==0 ){
    /* If there is no type specified, columns have the default affinity
    ** 'BLOB' with a default size of 4 bytes. */
    pCol->affinity = affinity;
    pCol->eCType = eType;
    pCol->szEst = szEst;
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( affinity==SQLITE_AFF_BLOB ){
      if( 4>=sqlite3GlobalConfig.szSorterRef ){
        pCol->colFlags |= COLFLAG_SORTERREF;
      }
    }
#endif
  }else{
    zType = z + sqlite3Strlen30(z) + 1;
    memcpy(zType, sType.z, sType.n);
    zType[sType.n] = 0;
    sqlite3Dequote(zType);
    pCol->affinity = sqlite3AffinityType(zType, pCol);
    pCol->colFlags |= COLFLAG_HASTYPE;
  }
  p->nCol++;
  p->nNVCol++;
  pParse->constraintName.n = 0;
}